

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

word * capnp::_::WireHelpers::copyMessage
                 (SegmentBuilder **segment,CapTableBuilder *capTable,WirePointer **dst,
                 WirePointer *src)

{
  ushort uVar1;
  BuilderArena *pBVar2;
  Exception *pEVar3;
  WirePointer *pWVar4;
  CapTableBuilder *pCVar5;
  byte bVar6;
  SegmentBuilder *pSVar7;
  WirePointer *pWVar8;
  WirePointer *pWVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  AllocateResult AVar15;
  SegmentBuilder *subSegment;
  WirePointer *dstRef;
  Fault local_80;
  WirePointer *local_78;
  WirePointer *local_70;
  WirePointer *local_68;
  WirePointer *local_60;
  WirePointer *local_58;
  CapTableBuilder *local_50;
  uint local_44;
  SegmentBuilder **local_40;
  ulong local_38;
  
  uVar14 = (src->offsetAndKind).value;
  iVar13 = (int)uVar14 >> 2;
  local_78 = src;
  local_68 = (WirePointer *)dst;
  local_50 = capTable;
  switch(uVar14 & 3) {
  case 0:
    uVar11 = (src->field_1).upper32Bits;
    if (uVar11 == 0 && uVar14 == 0) {
      pWVar9 = *dst;
      pWVar9->offsetAndKind = 0;
      pWVar9->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      return (word *)0x0;
    }
    uVar14 = (uVar11 & 0xffff) + (uVar11 >> 0x10);
    pWVar9 = *dst;
    if ((pWVar9->field_1).upper32Bits != 0 || (pWVar9->offsetAndKind).value != 0) {
      zeroObject(*segment,capTable,pWVar9);
    }
    if (uVar14 == 0) {
      local_70 = *dst;
      (local_70->offsetAndKind).value = 0xfffffffc;
    }
    else {
      pSVar7 = *segment;
      local_70 = (WirePointer *)pSVar7->pos;
      if ((long)(ulong)uVar14 <=
          (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)local_70)) >> 3) {
        pSVar7->pos = (word *)(local_70 + uVar14);
        if (local_70 != (WirePointer *)0x0) {
          ((*dst)->offsetAndKind).value =
               ((uint)((ulong)((long)local_70 - (long)*dst) >> 1) & 0xfffffffc) - 4;
          goto LAB_0020075b;
        }
        pSVar7 = *segment;
      }
      AVar15 = BuilderArena::allocate
                         ((BuilderArena *)(pSVar7->super_SegmentReader).arena,uVar14 + 1);
      local_70 = (WirePointer *)AVar15.words;
      pSVar7 = AVar15.segment;
      *segment = pSVar7;
      pWVar9 = *dst;
      (pWVar9->offsetAndKind).value =
           (int)AVar15.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
      pWVar9->field_1 =
           (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
      *dst = local_70;
      (local_70->offsetAndKind).value = 0;
      local_70 = local_70 + 1;
    }
LAB_0020075b:
    pEVar3 = (Exception *)*segment;
    uVar1 = *(ushort *)&src->field_1;
    uVar14 = (uint)uVar1;
    uVar12 = (ulong)(src->field_1).structRef.ptrCount.value;
    if (uVar1 == 0) {
      uVar14 = 0;
    }
    else {
      memcpy(local_70,src + (long)iVar13 + 1,(ulong)((uint)uVar1 * 8));
    }
    pCVar5 = local_50;
    if (uVar12 != 0) {
      pWVar8 = (WirePointer *)
               ((long)&src[(long)iVar13 + 1].offsetAndKind.value + (ulong)(uVar14 << 3));
      pWVar9 = (WirePointer *)((long)&(local_70->offsetAndKind).value + (ulong)(uVar14 << 3));
      do {
        local_80.exception = pEVar3;
        local_60 = pWVar9;
        copyMessage((SegmentBuilder **)&local_80,pCVar5,&local_60,pWVar8);
        pWVar9 = pWVar9 + 1;
        pWVar8 = pWVar8 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    (*(WirePointer **)local_68)->field_1 = local_78->field_1;
    return (word *)local_70;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x3ee,FAILED,(char *)0x0,"\"Unchecked messages cannot contain far pointers.\"",
               (char (*) [48])"Unchecked messages cannot contain far pointers.");
    kj::_::Debug::Fault::fatal(&local_80);
  case 3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x3eb,FAILED,(char *)0x0,
               "\"Unchecked messages cannot contain OTHER pointers (e.g. capabilities).\"",
               (char (*) [70])
               "Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
    kj::_::Debug::Fault::fatal(&local_80);
  }
  uVar14 = (src->field_1).upper32Bits;
  bVar6 = (byte)uVar14 & 7;
  if (5 < bVar6) {
    if ((uVar14 & 7) != 6) {
      uVar11 = uVar14 >> 3;
      if (uVar11 == 0x1fffffff) {
        copyMessage::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_60);
      }
      pWVar9 = *dst;
      if ((pWVar9->field_1).upper32Bits != 0 || (pWVar9->offsetAndKind).value != 0) {
        zeroObject(*segment,local_50,pWVar9);
      }
      local_58 = local_78 + (long)iVar13 + 1;
      pSVar7 = *segment;
      local_70 = (WirePointer *)pSVar7->pos;
      if ((long)(ulong)(uVar11 + 1) <=
          (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)local_70)) >> 3) {
        pSVar7->pos = (word *)(local_70 + (uVar11 + 1));
        if (local_70 != (WirePointer *)0x0) {
          pWVar9 = *dst;
          (pWVar9->offsetAndKind).value =
               ((uint)((ulong)((long)local_70 - (long)pWVar9) >> 1) & 0xfffffffc) - 3;
          goto LAB_00200920;
        }
        pSVar7 = *segment;
      }
      pBVar2 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
      if (0xffffffef < uVar14) {
        allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_80);
      }
      AVar15 = BuilderArena::allocate(pBVar2,uVar11 + 2);
      pWVar9 = (WirePointer *)AVar15.words;
      pSVar7 = AVar15.segment;
      *segment = pSVar7;
      pWVar8 = *dst;
      (pWVar8->offsetAndKind).value =
           (int)AVar15.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
      pWVar8->field_1 =
           (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
      *dst = pWVar9;
      (pWVar9->offsetAndKind).value = 1;
      local_70 = pWVar9 + 1;
LAB_00200920:
      pCVar5 = local_50;
      (pWVar9->field_1).upper32Bits = (local_78->field_1).upper32Bits | 7;
      *local_70 = *local_58;
      uVar14 = (local_58->offsetAndKind).value;
      if ((uVar14 & 3) != 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
                  (&local_80,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x3dd,FAILED,"srcTag->kind() == WirePointer::STRUCT",
                   "\"INLINE_COMPOSITE of lists is not yet supported.\"",
                   (char (*) [48])"INLINE_COMPOSITE of lists is not yet supported.");
        kj::_::Debug::Fault::fatal(&local_80);
      }
      local_44 = uVar14 >> 2 & 0x1fffffff;
      if (local_44 == 0) {
        return (word *)local_70;
      }
      local_78 = local_58 + 1;
      local_68 = local_70 + 1;
      uVar14 = (uint)(local_58->field_1).structRef.dataSize.value;
      uVar1 = (local_58->field_1).structRef.ptrCount.value;
      local_38 = 0;
      local_40 = segment;
      do {
        uVar12 = (ulong)uVar1;
        pEVar3 = (Exception *)*local_40;
        if ((short)uVar14 == 0) {
          uVar14 = 0;
        }
        else {
          memcpy(local_68,local_78,(ulong)(uVar14 << 3));
        }
        if (uVar1 != 0) {
          pWVar9 = (WirePointer *)((long)&(local_78->offsetAndKind).value + (ulong)(uVar14 << 3));
          pWVar8 = (WirePointer *)((long)&(local_68->offsetAndKind).value + (ulong)(uVar14 << 3));
          do {
            local_80.exception = pEVar3;
            local_60 = pWVar8;
            copyMessage((SegmentBuilder **)&local_80,pCVar5,&local_60,pWVar9);
            pWVar8 = pWVar8 + 1;
            pWVar9 = pWVar9 + 1;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
        uVar14 = (uint)(local_58->field_1).structRef.dataSize.value;
        uVar1 = *(ushort *)((long)&local_58->field_1 + 2);
        uVar12 = (ulong)((uVar1 + uVar14) * 8);
        local_78 = (WirePointer *)((long)&(local_78->offsetAndKind).value + uVar12);
        local_68 = (WirePointer *)((long)&(local_68->offsetAndKind).value + uVar12);
        uVar11 = (int)local_38 + 1;
        local_38 = (ulong)uVar11;
      } while (uVar11 != local_44);
      return (word *)local_70;
    }
    uVar14 = uVar14 >> 3;
    pWVar9 = *dst;
    if ((pWVar9->field_1).upper32Bits != 0 || (pWVar9->offsetAndKind).value != 0) {
      zeroObject(*segment,capTable,pWVar9);
    }
    pSVar7 = *segment;
    local_70 = (WirePointer *)pSVar7->pos;
    if ((long)(ulong)uVar14 <=
        (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
              ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)local_70)) >> 3) {
      pSVar7->pos = (word *)(local_70 + uVar14);
      if (local_70 != (WirePointer *)0x0) {
        pWVar8 = *dst;
        (pWVar8->offsetAndKind).value =
             ((uint)((ulong)((long)local_70 - (long)pWVar8) >> 1) & 0xfffffffc) - 3;
        goto LAB_00200852;
      }
      pSVar7 = *segment;
    }
    pBVar2 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
    if (uVar14 == 0x1fffffff) {
      allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_80);
    }
    AVar15 = BuilderArena::allocate(pBVar2,uVar14 + 1);
    pWVar8 = (WirePointer *)AVar15.words;
    pSVar7 = AVar15.segment;
    *segment = pSVar7;
    pWVar9 = *dst;
    (pWVar9->offsetAndKind).value =
         (int)AVar15.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
    pWVar9->field_1 =
         (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
    *dst = pWVar8;
    (pWVar8->offsetAndKind).value = 1;
    local_70 = pWVar8 + 1;
LAB_00200852:
    uVar14 = (local_78->field_1).upper32Bits;
    if (7 < uVar14) {
      pWVar9 = local_78 + iVar13;
      uVar12 = (ulong)(uVar14 >> 3);
      pWVar8 = local_70;
      do {
        pWVar9 = pWVar9 + 1;
        local_80.exception = (Exception *)*segment;
        local_60 = pWVar8;
        copyMessage((SegmentBuilder **)&local_80,capTable,&local_60,pWVar9);
        pWVar8 = pWVar8 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      pWVar8 = *(WirePointer **)local_68;
      uVar14 = (local_78->field_1).upper32Bits;
    }
    (pWVar8->field_1).upper32Bits = uVar14 & 0xfffffff8 | 6;
    return (word *)local_70;
  }
  uVar12 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)bVar6 * 4) * (ulong)(uVar14 >> 3) + 0x3f
           >> 6;
  pWVar9 = *dst;
  if ((pWVar9->field_1).upper32Bits != 0 || (pWVar9->offsetAndKind).value != 0) {
    zeroObject(*segment,capTable,pWVar9);
  }
  pSVar7 = *segment;
  pWVar9 = (WirePointer *)pSVar7->pos;
  iVar10 = (int)uVar12;
  uVar12 = uVar12 & 0xffffffff;
  if ((long)uVar12 <=
      (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
            ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pWVar9)) >> 3) {
    pSVar7->pos = (word *)(pWVar9 + uVar12);
    if (pWVar9 != (WirePointer *)0x0) {
      pWVar8 = *dst;
      (pWVar8->offsetAndKind).value =
           ((uint)((ulong)((long)pWVar9 - (long)pWVar8) >> 1) & 0xfffffffc) - 3;
      goto LAB_00200654;
    }
    pSVar7 = *segment;
  }
  pBVar2 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
  if (0x1fffffff < iVar10 + 1U) {
    allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_80);
  }
  AVar15 = BuilderArena::allocate(pBVar2,iVar10 + 1U);
  pWVar8 = (WirePointer *)AVar15.words;
  pSVar7 = AVar15.segment;
  *segment = pSVar7;
  pWVar9 = *dst;
  (pWVar9->offsetAndKind).value =
       (int)AVar15.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
  pWVar9->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
  *dst = pWVar8;
  (pWVar8->offsetAndKind).value = 1;
  pWVar9 = pWVar8 + 1;
LAB_00200654:
  pWVar4 = local_78;
  if (iVar10 != 0) {
    memcpy(pWVar9,local_78 + (long)iVar13 + 1,(ulong)(uint)(iVar10 << 3));
    pWVar8 = *dst;
  }
  pWVar8->field_1 = pWVar4->field_1;
  return (word *)pWVar9;
}

Assistant:

static word* copyMessage(
      SegmentBuilder*& segment, CapTableBuilder* capTable,
      WirePointer*& dst, const WirePointer* src) {
    // Not always-inline because it's recursive.

    switch (src->kind()) {
      case WirePointer::STRUCT: {
        if (src->isNull()) {
          zeroMemory(dst);
          return nullptr;
        } else {
          const word* srcPtr = src->target(nullptr);
          word* dstPtr = allocate(
              dst, segment, capTable, src->structRef.wordSize(), WirePointer::STRUCT, nullptr);

          copyStruct(segment, capTable, dstPtr, srcPtr, src->structRef.dataSize.get(),
                     src->structRef.ptrCount.get());

          dst->structRef.set(src->structRef.dataSize.get(), src->structRef.ptrCount.get());
          return dstPtr;
        }
      }
      case WirePointer::LIST: {
        switch (src->listRef.elementSize()) {
          case ElementSize::VOID:
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto wordCount = roundBitsUpToWords(
                upgradeBound<uint64_t>(src->listRef.elementCount()) *
                dataBitsPerElement(src->listRef.elementSize()));
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable, wordCount, WirePointer::LIST, nullptr);
            copyMemory(dstPtr, srcPtr, wordCount);

            dst->listRef.set(src->listRef.elementSize(), src->listRef.elementCount());
            return dstPtr;
          }

          case ElementSize::POINTER: {
            const WirePointer* srcRefs = reinterpret_cast<const WirePointer*>(src->target(nullptr));
            WirePointer* dstRefs = reinterpret_cast<WirePointer*>(
                allocate(dst, segment, capTable, src->listRef.elementCount() *
                    (ONE * POINTERS / ELEMENTS) * WORDS_PER_POINTER,
                    WirePointer::LIST, nullptr));

            for (auto i: kj::zeroTo(src->listRef.elementCount() * (ONE * POINTERS / ELEMENTS))) {
              SegmentBuilder* subSegment = segment;
              WirePointer* dstRef = dstRefs + i;
              copyMessage(subSegment, capTable, dstRef, srcRefs + i);
            }

            dst->listRef.set(ElementSize::POINTER, src->listRef.elementCount());
            return reinterpret_cast<word*>(dstRefs);
          }

          case ElementSize::INLINE_COMPOSITE: {
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable,
                assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
                    src->listRef.inlineCompositeWordCount() + POINTER_SIZE_IN_WORDS,
                    []() { KJ_FAIL_ASSERT("list too big to fit in a segment"); }),
                WirePointer::LIST, nullptr);

            dst->listRef.setInlineComposite(src->listRef.inlineCompositeWordCount());

            const WirePointer* srcTag = reinterpret_cast<const WirePointer*>(srcPtr);
            copyMemory(reinterpret_cast<WirePointer*>(dstPtr), srcTag);

            const word* srcElement = srcPtr + POINTER_SIZE_IN_WORDS;
            word* dstElement = dstPtr + POINTER_SIZE_IN_WORDS;

            KJ_ASSERT(srcTag->kind() == WirePointer::STRUCT,
                "INLINE_COMPOSITE of lists is not yet supported.");

            for (auto i KJ_UNUSED: kj::zeroTo(srcTag->inlineCompositeListElementCount())) {
              copyStruct(segment, capTable, dstElement, srcElement,
                  srcTag->structRef.dataSize.get(), srcTag->structRef.ptrCount.get());
              srcElement += srcTag->structRef.wordSize();
              dstElement += srcTag->structRef.wordSize();
            }
            return dstPtr;
          }
        }
        break;
      }
      case WirePointer::OTHER:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
        break;
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain far pointers.");
        break;
    }

    return nullptr;
  }